

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall Catch::XmlWriter::writeText(XmlWriter *this,string *text,bool indent)

{
  ulong uVar1;
  byte in_DL;
  XmlWriter *in_RDI;
  bool tagWasOpen;
  XmlEncode *xmlEncode;
  XmlWriter *in_stack_ffffffffffffffa0;
  ostream *os;
  XmlEncode *in_stack_ffffffffffffffb0;
  ostream local_40 [46];
  byte local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_12 = in_RDI->m_tagIsOpen & 1;
    ensureTagClosed(in_stack_ffffffffffffffa0);
    if (((local_12 & 1) != 0) && ((local_11 & 1) != 0)) {
      std::operator<<(in_RDI->m_os,(string *)&in_RDI->m_indent);
    }
    xmlEncode = (XmlEncode *)in_RDI->m_os;
    os = local_40;
    XmlEncode::XmlEncode(in_stack_ffffffffffffffb0,(string *)in_RDI,(ForWhat)((ulong)os >> 0x20));
    Catch::operator<<(os,xmlEncode);
    XmlEncode::~XmlEncode((XmlEncode *)0x1318d1);
    in_RDI->m_needsNewline = true;
  }
  return in_RDI;
}

Assistant:

XmlWriter& XmlWriter::writeText( std::string const& text, bool indent ) {
        if( !text.empty() ){
            bool tagWasOpen = m_tagIsOpen;
            ensureTagClosed();
            if( tagWasOpen && indent )
                m_os << m_indent;
            m_os << XmlEncode( text );
            m_needsNewline = true;
        }
        return *this;
    }